

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
                 (char *buffer,uint value,int num_digits,add_thousands_sep<char> thousands_sep)

{
  uint uVar1;
  uint index;
  uint index_1;
  char *end;
  int num_digits_local;
  uint value_local;
  char *buffer_local;
  
  if (num_digits < 0) {
    _num_digits_local = buffer;
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3c0,
                  "Char *fmt::internal::format_decimal(Char *, UInt, int, ThousandsSep) [UInt = unsigned int, Char = char, ThousandsSep = fmt::internal::add_thousands_sep<char>]"
                 );
  }
  end._4_4_ = value;
  _num_digits_local = buffer + num_digits;
  while (99 < end._4_4_) {
    uVar1 = (end._4_4_ % 100) * 2;
    end._4_4_ = end._4_4_ / 100;
    _num_digits_local[-1] = basic_data<void>::DIGITS[uVar1 + 1];
    _num_digits_local = _num_digits_local + -1;
    add_thousands_sep<char>::operator()(&thousands_sep,(char **)&num_digits_local);
    _num_digits_local[-1] = basic_data<void>::DIGITS[uVar1];
    _num_digits_local = _num_digits_local + -1;
    add_thousands_sep<char>::operator()(&thousands_sep,(char **)&num_digits_local);
  }
  if (end._4_4_ < 10) {
    _num_digits_local[-1] = (char)end._4_4_ + '0';
  }
  else {
    _num_digits_local[-1] = basic_data<void>::DIGITS[end._4_4_ * 2 + 1];
    _num_digits_local = _num_digits_local + -1;
    add_thousands_sep<char>::operator()(&thousands_sep,(char **)&num_digits_local);
    _num_digits_local[-1] = basic_data<void>::DIGITS[end._4_4_ * 2];
  }
  return buffer + num_digits;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}